

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O0

void __thiscall
m2d::savanna::ssl_reuse::
http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::on_read_l(http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
            *this,error_code ec,size_t bytes_transferred)

{
  delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *pdVar1;
  bool bVar2;
  int iVar3;
  element_type *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar4;
  int __type;
  int __domain;
  http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *phVar5;
  error_condition *rhs;
  bool local_231;
  bool local_225;
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_218;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_170;
  http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *local_78;
  undefined1 local_70 [24];
  undefined8 local_58;
  http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *local_48;
  undefined1 local_40 [24];
  size_t local_28;
  size_t bytes_transferred_local;
  http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *this_local;
  error_code ec_local;
  
  uVar4 = (undefined4)bytes_transferred;
  ec_local._0_8_ = ec.cat_;
  phVar5 = ec._0_8_;
  local_28 = bytes_transferred;
  bytes_transferred_local = (size_t)this;
  this_local = phVar5;
  bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)&this_local);
  __domain = (int)phVar5;
  iVar3 = CONCAT31((int3)((uint)uVar4 >> 8),bVar2);
  local_225 = false;
  if (bVar2) {
    boost::system::error_condition::error_condition<boost::system::errc::errc_t>
              ((error_condition *)(local_40 + 8),not_connected,(type *)0x0);
    rhs = (error_condition *)(local_40 + 8);
    local_225 = boost::system::operator!=((error_code *)&this_local,rhs);
    __domain = (int)rhs;
  }
  if (local_225 != false) {
    local_48 = this_local;
    local_40._0_4_ = ec_local.val_;
    local_40[4] = ec_local.failed_;
    local_40._5_3_ = ec_local._5_3_;
    phVar5 = this_local;
    (*(this->super_interface)._vptr_interface[8])(this,this_local,ec_local._0_8_);
    __domain = (int)phVar5;
  }
  this_00 = std::
            __shared_ptr_access<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->tcp_stream_);
  iVar3 = boost::beast::
          basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
          ::socket(this_00,__domain,__type,iVar3);
  iVar3 = boost::asio::
          basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::shutdown((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)CONCAT44(extraout_var,iVar3),2,(int)&this_local);
  local_58 = CONCAT44(extraout_var_00,iVar3);
  bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)&this_local);
  local_231 = false;
  if (bVar2) {
    boost::system::error_condition::error_condition<boost::system::errc::errc_t>
              ((error_condition *)(local_70 + 8),not_connected,(type *)0x0);
    local_231 = boost::system::operator!=
                          ((error_code *)&this_local,(error_condition *)(local_70 + 8));
  }
  if (local_231 == false) {
    if (this->delegate_ !=
        (delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
         *)0x0) {
      pdVar1 = this->delegate_;
      boost::beast::http::
      message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::message(&local_218,&this->response_);
      result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
      ::result(&local_170,&local_218);
      (**pdVar1->_vptr_delegate)(pdVar1,&local_170);
      result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
      ::~result(&local_170);
      boost::beast::http::
      message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::~message(&local_218);
    }
  }
  else {
    local_78 = this_local;
    local_70._0_4_ = ec_local.val_;
    local_70[4] = ec_local.failed_;
    local_70._5_3_ = ec_local._5_3_;
    (*(this->super_interface)._vptr_interface[8])(this,this_local,ec_local._0_8_);
  }
  return;
}

Assistant:

void on_read_l(beast::error_code ec, std::size_t bytes_transferred) override {
			if (ec && ec != beast::errc::not_connected) {
				error_callback(ec);
			}
			tcp_stream_->socket().shutdown(tcp::socket::shutdown_both, ec);
			if (ec && ec != beast::errc::not_connected) {
				error_callback(ec);
			}else {
				if(delegate_) delegate_->completion_callback(savanna::result<http::response<Body>>(std::move(response_)));
			}
		}